

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int bmcg_sat_solver_equiv_overlap_check
              (bmcg_sat_solver *pSat,Gia_Man_t *p,int iLit0,int iLit1,int fEquiv)

{
  int iVar1;
  int iVar2;
  int c;
  Vec_Int_t *p_00;
  bool bVar3;
  int local_74;
  int local_70;
  int status;
  int Lits [2];
  int iSatLit [2];
  int iSatVar [2];
  int iVar;
  int i;
  Vec_Int_t *vObjsUsed;
  bmcg_sat_solver *pSats [2];
  int fEquiv_local;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  bmcg_sat_solver *pSat_local;
  
  pSats[0] = (bmcg_sat_solver *)0x0;
  vObjsUsed = (Vec_Int_t *)pSat;
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_IntSize(&p->vCopies);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 < iVar2) {
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFillExtra(&p->vCopies,iVar1,-1);
  }
  iVar1 = Vec_IntSize(p_00);
  Vec_IntPush(p_00,0);
  Gia_ObjSetCopyArray(p,0,iVar1);
  if (iVar1 != 0) {
    __assert_fail("iVar == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                  ,0x4e3,
                  "int bmcg_sat_solver_equiv_overlap_check(bmcg_sat_solver *, Gia_Man_t *, int, int, int)"
                 );
  }
  iVar1 = Abc_Lit2Var(iLit0);
  iVar1 = Gia_ManSatAndCollect_rec(p,iVar1,p_00,(Vec_Int_t *)0x0);
  iVar2 = Abc_Lit2Var(iLit1);
  iVar2 = Gia_ManSatAndCollect_rec(p,iVar2,p_00,(Vec_Int_t *)0x0);
  c = Abc_LitIsCompl(iLit0);
  Lits[0] = Abc_Var2Lit(iVar1,c);
  iVar1 = Abc_LitIsCompl(iLit1);
  Lits[1] = Abc_Var2Lit(iVar2,iVar1);
  Gia_ManQuantLoadCnf(p,p_00,&vObjsUsed);
  for (iSatVar[1] = 0; iVar1 = Vec_IntSize(p_00), iSatVar[1] < iVar1; iSatVar[1] = iSatVar[1] + 1) {
    iVar1 = Vec_IntEntry(p_00,iSatVar[1]);
    Gia_ObjSetCopyArray(p,iVar1,-1);
  }
  Vec_IntFree(p_00);
  if (fEquiv == 0) {
    local_70 = Lits[0];
    status = Lits[1];
    iVar1 = bmcg_sat_solver_solve(vObjsUsed,&local_70,2);
    bVar3 = iVar1 == 1;
  }
  else {
    local_70 = Lits[0];
    status = Abc_LitNot(Lits[1]);
    local_74 = bmcg_sat_solver_solve(vObjsUsed,&local_70,2);
    if (local_74 == -1) {
      local_70 = Abc_LitNot(Lits[0]);
      status = Lits[1];
      local_74 = bmcg_sat_solver_solve(vObjsUsed,&local_70,2);
    }
    bVar3 = local_74 == -1;
  }
  pSat_local._4_4_ = (uint)bVar3;
  return pSat_local._4_4_;
}

Assistant:

int bmcg_sat_solver_equiv_overlap_check( bmcg_sat_solver * pSat, Gia_Man_t * p, int iLit0, int iLit1, int fEquiv )
{
    bmcg_sat_solver * pSats[2] = { pSat, NULL };
    Vec_Int_t * vObjsUsed = Vec_IntAlloc( 100 ); 
    int i, iVar, iSatVar[2], iSatLit[2], Lits[2], status;
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );

    // assign const0 variable number 0
    iVar = Vec_IntSize(vObjsUsed);
    Vec_IntPush( vObjsUsed, 0 );
    Gia_ObjSetCopyArray( p, 0, iVar );
    assert( iVar == 0 );

    iSatVar[0] = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit0), vObjsUsed, NULL );
    iSatVar[1] = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit1), vObjsUsed, NULL );

    iSatLit[0] = Abc_Var2Lit( iSatVar[0], Abc_LitIsCompl(iLit0) );
    iSatLit[1] = Abc_Var2Lit( iSatVar[1], Abc_LitIsCompl(iLit1) );
    Gia_ManQuantLoadCnf( p, vObjsUsed, pSats );
    Vec_IntForEachEntry( vObjsUsed, iVar, i )
        Gia_ObjSetCopyArray( p, iVar, -1 );
    Vec_IntFree( vObjsUsed );

    if ( fEquiv )
    {
        Lits[0] = iSatLit[0];
        Lits[1] = Abc_LitNot(iSatLit[1]);
        status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        if ( status == GLUCOSE_UNSAT )
        {
            Lits[0] = Abc_LitNot(iSatLit[0]);
            Lits[1] = iSatLit[1];
            status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        }
        return status == GLUCOSE_UNSAT;
    }
    else
    {
        Lits[0] = iSatLit[0];
        Lits[1] = iSatLit[1];
        status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        return status == GLUCOSE_SAT;
    }
}